

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O3

bool __thiscall
HPack::Encoder::encodeRequestPseudoHeaders
          (Encoder *this,BitOStream *outputStream,HttpHeader *header)

{
  pointer pHVar1;
  char *__s1;
  size_t __n;
  QDebug QVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t *psVar6;
  storage_type *psVar7;
  long lVar8;
  pointer field;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  bool headerFound [3];
  QByteArrayView headerName [3];
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined8 uStack_a4;
  undefined4 local_9c;
  char *local_98;
  QDebug local_90;
  QArrayData *local_88 [3];
  char local_6c [4];
  size_t local_68;
  char *local_60;
  size_t local_58;
  char *local_50;
  size_t local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 10;
  local_60 = ":authority";
  local_58 = 7;
  local_50 = ":scheme";
  local_48 = 5;
  local_40 = ":path";
  local_6c[2] = '\0';
  local_6c[0] = '\0';
  local_6c[1] = '\0';
  field = (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
          _M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (field == pHVar1) {
LAB_001d9d13:
    encodeRequestPseudoHeaders();
  }
  else {
    bVar4 = false;
    do {
      local_b0 = 0x264385;
      uStack_ac = 0;
      bVar3 = ::operator==(&field->name,(char **)&local_b0);
      if (bVar3) {
        encodeRequestPseudoHeaders();
        goto LAB_001d9d26;
      }
      local_b0 = 0x2643f3;
      uStack_ac = 0;
      bVar3 = ::operator==(&field->name,(char **)&local_b0);
      if (bVar3) {
        if (bVar4) {
          encodeRequestPseudoHeaders();
          goto LAB_001d9d26;
        }
        encodeMethod(this,outputStream,field);
        bVar4 = true;
      }
      else {
        local_b0 = 0x25d9b3;
        uStack_ac = 0;
        bVar3 = ::operator==(&field->name,(char **)&local_b0);
        if (!bVar3) {
          __s1 = (field->name).d.ptr;
          __n = (field->name).d.size;
          psVar6 = (size_t *)&local_60;
          lVar8 = 0;
          do {
            if ((__n == psVar6[-1]) &&
               ((__n == 0 || (iVar5 = bcmp(__s1,(void *)*psVar6,__n), iVar5 == 0)))) {
              if (local_6c[lVar8] == '\x01') {
                local_b0 = 2;
                uStack_ac = 0;
                uStack_a8 = 0;
                uStack_a4 = 0;
                local_9c = 0;
                local_98 = "default";
                QMessageLogger::critical();
                QVar2.stream = local_90.stream;
                QVar11.m_data = (storage_type *)0x8;
                QVar11.m_size = (qsizetype)local_88;
                QString::fromUtf8(QVar11);
                QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_88);
                if (local_88[0] != (QArrayData *)0x0) {
                  LOCK();
                  (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_88[0],2,0x10);
                  }
                }
                if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
                  QTextStream::operator<<((QTextStream *)local_90.stream,' ');
                }
                QDebug::putByteArray((char *)&local_90,*psVar6,(Latin1Content)psVar6[-1]);
                if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
                  QTextStream::operator<<((QTextStream *)local_90.stream,' ');
                }
                psVar7 = &DAT_00000018;
                goto LAB_001d9cbe;
              }
              bVar3 = encodeHeaderField(this,outputStream,field);
              if (!bVar3) goto LAB_001d9d26;
              local_6c[lVar8] = '\x01';
              break;
            }
            lVar8 = lVar8 + 1;
            psVar6 = psVar6 + 2;
          } while (lVar8 != 3);
        }
      }
      field = field + 1;
    } while (field != pHVar1);
    if (!bVar4) goto LAB_001d9d13;
    psVar6 = &local_58;
    if (local_6c[1] != '\0') {
      bVar4 = true;
      psVar6 = &local_48;
      if (local_6c[2] == '\x01') goto LAB_001d9d28;
    }
    local_b0 = 2;
    uStack_ac = 0;
    uStack_a8 = 0;
    uStack_a4 = 0;
    local_9c = 0;
    local_98 = "default";
    QMessageLogger::critical();
    QVar2.stream = local_90.stream;
    QVar9.m_data = (storage_type *)0x9;
    QVar9.m_size = (qsizetype)local_88;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_88);
    if (local_88[0] != (QArrayData *)0x0) {
      LOCK();
      (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_90.stream,' ');
    }
    QDebug::putByteArray((char *)&local_90,psVar6[1],(Latin1Content)*psVar6);
    if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_90.stream,' ');
    }
    psVar7 = (storage_type *)0x17;
LAB_001d9cbe:
    QVar2.stream = local_90.stream;
    QVar10.m_data = psVar7;
    QVar10.m_size = (qsizetype)local_88;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_88);
    if (local_88[0] != (QArrayData *)0x0) {
      LOCK();
      (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_90.stream,' ');
    }
    QDebug::~QDebug(&local_90);
  }
LAB_001d9d26:
  bVar4 = false;
LAB_001d9d28:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool Encoder::encodeRequestPseudoHeaders(BitOStream &outputStream,
                                         const HttpHeader &header)
{
    // The following pseudo-header fields are defined for HTTP/2 requests:
    // - The :method pseudo-header field includes the HTTP method
    // - The :scheme pseudo-header field includes the scheme portion of the target URI
    // - The :authority pseudo-header field includes the authority portion of the target URI
    // - The :path pseudo-header field includes the path and query parts of the target URI

    // All HTTP/2 requests MUST include exactly one valid value for the :method,
    // :scheme, and :path pseudo-header fields, unless it is a CONNECT request
    // (Section 8.3). An HTTP request that omits mandatory pseudo-header fields
    // is malformed (Section 8.1.2.6).

    using size_type = decltype(header.size());

    bool methodFound = false;
    constexpr QByteArrayView headerName[] = {":authority", ":scheme", ":path"};
    constexpr size_type nHeaders = std::size(headerName);
    bool headerFound[nHeaders] = {};

    for (const auto &field : header) {
        if (field.name == ":status") {
            qCritical("invalid pseudo-header (:status) in a request");
            return false;
        }

        if (field.name == ":method") {
            if (methodFound) {
                qCritical("only one :method pseudo-header is allowed");
                return false;
            }

            if (!encodeMethod(outputStream, field))
                return false;
            methodFound = true;
        } else if (field.name == "cookie") {
            // "crumbs" ...
        } else {
            for (size_type j = 0; j < nHeaders; ++j) {
                if (field.name == headerName[j]) {
                    if (headerFound[j]) {
                        qCritical() << "only one" << headerName[j] << "pseudo-header is allowed";
                        return false;
                    }
                    if (!encodeHeaderField(outputStream, field))
                        return false;
                    headerFound[j] = true;
                    break;
                }
            }
        }
    }

    if (!methodFound) {
        qCritical("mandatory :method pseudo-header not found");
        return false;
    }

    // 1: don't demand headerFound[0], as :authority isn't mandatory.
    for (size_type i = 1; i < nHeaders; ++i) {
        if (!headerFound[i]) {
            qCritical() << "mandatory" << headerName[i]
                        << "pseudo-header not found";
            return false;
        }
    }

    return true;
}